

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comment_on_column_info.cpp
# Opt level: O2

void __thiscall duckdb::SetColumnCommentInfo::SetColumnCommentInfo(SetColumnCommentInfo *this)

{
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  LogicalType local_98;
  string local_80;
  string local_60;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_60,anon_var_dwarf_4b0ffdd + 9,&local_9b);
  ::std::__cxx11::string::string((string *)&local_80,anon_var_dwarf_4b0ffdd + 9,&local_99);
  ::std::__cxx11::string::string((string *)&local_40,anon_var_dwarf_4b0ffdd + 9,&local_9a);
  AlterInfo::AlterInfo
            (&this->super_AlterInfo,SET_COLUMN_COMMENT,&local_60,&local_80,&local_40,THROW_EXCEPTION
            );
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetColumnCommentInfo_027a7fd8;
  (this->super_AlterInfo).field_0x71 = 0;
  ::std::__cxx11::string::string((string *)&this->column_name,anon_var_dwarf_4b0ffdd + 9,&local_9b);
  LogicalType::LogicalType(&local_98,SQLNULL);
  Value::Value(&this->comment_value,&local_98);
  LogicalType::~LogicalType(&local_98);
  return;
}

Assistant:

SetColumnCommentInfo::SetColumnCommentInfo()
    : AlterInfo(AlterType::SET_COLUMN_COMMENT, INVALID_CATALOG, INVALID_SCHEMA, "", OnEntryNotFound::THROW_EXCEPTION),
      catalog_entry_type(CatalogType::INVALID), column_name(""), comment_value(Value()) {
}